

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O2

int arkPredict_Bootstrap
              (ARKodeMem ark_mem,realtype hj,realtype tau,int nvec,realtype *cvals,N_Vector *Xvecs,
              N_Vector yguess)

{
  int iVar1;
  ulong uVar2;
  char *msgfmt;
  ulong uVar3;
  double dVar4;
  
  if (ark_mem == (ARKodeMem)0x0) {
    msgfmt = "ARKodeMem structure is NULL";
    ark_mem = (ARKodeMem)0x0;
  }
  else {
    if (ark_mem->interp != (ARKInterp)0x0) {
      dVar4 = (tau * tau * 0.5) / hj;
      uVar2 = 0;
      uVar3 = 0;
      if (0 < nvec) {
        uVar3 = (ulong)(uint)nvec;
      }
      for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
        cvals[uVar2 + 2] = cvals[uVar2] * dVar4;
        Xvecs[uVar2 + 2] = Xvecs[uVar2];
      }
      *cvals = 1.0;
      *Xvecs = ark_mem->yn;
      cvals[1] = tau - dVar4;
      Xvecs[1] = ark_mem->fn;
      iVar1 = N_VLinearCombination(nvec + 2,cvals,Xvecs,yguess);
      if (iVar1 != 0) {
        return -0x1c;
      }
      return 0;
    }
    msgfmt = "ARKodeInterpMem structure is NULL";
  }
  arkProcessError(ark_mem,-0x15,"ARKode","arkPredict_Bootstrap",msgfmt);
  return -0x15;
}

Assistant:

int arkPredict_Bootstrap(ARKodeMem ark_mem, realtype hj,
                         realtype tau, int nvec, realtype *cvals,
                         N_Vector *Xvecs, N_Vector yguess)
{
  realtype a0, a1, a2;
  int i, retval;

  /* verify that ark_mem and interpolation structure are provided */
  if (ark_mem == NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkPredict_Bootstrap",
                    "ARKodeMem structure is NULL");
    return(ARK_MEM_NULL);
  }
  if (ark_mem->interp == NULL) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode",
                    "arkPredict_Bootstrap",
                    "ARKodeInterpMem structure is NULL");
    return(ARK_MEM_NULL);
  }

  /* set coefficients for Hermite interpolant */
  a0 = ONE;
  a2 = tau*tau/TWO/hj;
  a1 = tau - a2;

  /* set arrays for fused vector operation; shift inputs for
     f(t_n+hj,z_j) to end of queue */
  for (i=0; i<nvec; i++) {
    cvals[2+i] = a2*cvals[i];
    Xvecs[2+i] = Xvecs[i];
  }
  cvals[0] = a0;
  Xvecs[0] = ark_mem->yn;
  cvals[1] = a1;
  Xvecs[1] = ark_mem->fn;

  /* call fused vector operation to compute prediction */
  retval = N_VLinearCombination(nvec+2, cvals, Xvecs, yguess);
  if (retval != 0)  return(ARK_VECTOROP_ERR);
  return(ARK_SUCCESS);
}